

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall TxConfirmStats::Record(TxConfirmStats *this,int blocksToConfirm,double feerate)

{
  long lVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  pointer pdVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  _Base_ptr p_Var11;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < blocksToConfirm) {
    p_Var9 = &(this->bucketMap->_M_t)._M_impl.super__Rb_tree_header._M_header;
    for (p_Var11 = (this->bucketMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[bVar7 && bVar6]) {
      bVar6 = feerate != *(double *)(p_Var11 + 1);
      bVar7 = *(double *)(p_Var11 + 1) <= feerate;
      if (!bVar7 || !bVar6) {
        p_Var9 = p_Var11;
      }
    }
    uVar10 = (ulong)*(uint *)&p_Var9[1]._M_parent;
    pvVar2 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (uVar8 = (ulong)(int)(((blocksToConfirm + this->scale) - 1) / this->scale);
        uVar8 <= (ulong)(((long)pvVar3 - (long)pvVar2 >> 3) * -0x5555555555555555);
        uVar8 = uVar8 + 1) {
      lVar4 = *(long *)&pvVar2[uVar8 - 1].super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data;
      *(double *)(lVar4 + uVar10 * 8) = *(double *)(lVar4 + uVar10 * 8) + 1.0;
    }
    pdVar5 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[uVar10] = pdVar5[uVar10] + 1.0;
    pdVar5 = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[uVar10] = feerate + pdVar5[uVar10];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::Record(int blocksToConfirm, double feerate)
{
    // blocksToConfirm is 1-based
    if (blocksToConfirm < 1)
        return;
    int periodsToConfirm = (blocksToConfirm + scale - 1) / scale;
    unsigned int bucketindex = bucketMap.lower_bound(feerate)->second;
    for (size_t i = periodsToConfirm; i <= confAvg.size(); i++) {
        confAvg[i - 1][bucketindex]++;
    }
    txCtAvg[bucketindex]++;
    m_feerate_avg[bucketindex] += feerate;
}